

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O1

void av1_finalize_encoded_frame(AV1_COMP *cpi)

{
  RefCntBuffer *pRVar1;
  RefCntBuffer *pRVar2;
  uint16_t uVar3;
  int i_1;
  uint *puVar4;
  uint16_t uVar5;
  int i;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int count [3];
  int local_28 [4];
  
  if (((((cpi->common).seq_params)->reduced_still_picture_hdr == '\0') &&
      ((cpi->common).show_existing_frame != 0)) &&
     (((cpi->common).features.error_resilient_mode != true ||
      ((cpi->common).current_frame.frame_type == '\0')))) {
    pRVar1 = (cpi->common).ref_frame_map[cpi->existing_fb_idx_to_show];
    if (pRVar1 == (RefCntBuffer *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_UNSUP_BITSTREAM,
                         "Buffer does not contain a reconstructed frame");
    }
    pRVar2 = (cpi->common).cur_frame;
    if (pRVar2 != (RefCntBuffer *)0x0) {
      pRVar2->ref_count = pRVar2->ref_count + -1;
    }
    (cpi->common).cur_frame = pRVar1;
    pRVar1->ref_count = pRVar1->ref_count + 1;
  }
  if (((((cpi->common).show_existing_frame == 0) ||
       (((cpi->common).features.error_resilient_mode == true &&
        ((cpi->common).current_frame.frame_type != '\0')))) &&
      (((cpi->common).seq_params)->film_grain_params_present != '\0')) &&
     (((cpi->common).show_frame != 0 || ((cpi->common).showable_frame != 0)))) {
    memcpy(&((cpi->common).cur_frame)->film_grain_params,&(cpi->common).film_grain_params,0x288);
    if ((cpi->common).current_frame.frame_type != '\x01') {
      (((cpi->common).cur_frame)->film_grain_params).update_parameters = 1;
    }
    uVar3 = (short)*(undefined4 *)&(cpi->common).film_grain_params.random_seed + 0xd35;
    uVar5 = 0x1cdf;
    if (uVar3 != 0) {
      uVar5 = uVar3;
    }
    (cpi->common).film_grain_params.random_seed = uVar5;
  }
  if (0 < (cpi->common).tiles.cols) {
    iVar7 = 0;
    do {
      if (0 < (cpi->common).tiles.rows) {
        iVar9 = 0;
        do {
          memcpy(&cpi->tile_data[(cpi->common).tiles.cols * iVar9 + iVar7].tctx,(cpi->common).fc,
                 0x52fc);
          iVar9 = iVar9 + 1;
        } while (iVar9 < (cpi->common).tiles.rows);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (cpi->common).tiles.cols);
  }
  if ((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
     ((cpi->common).features.interp_filter == MULTITAP_SHARP2)) {
    puVar4 = (uint *)(cpi->td).counts;
    local_28[2] = 0;
    local_28[0] = 0;
    local_28[1] = 0;
    lVar6 = 0;
    iVar7 = 0;
    do {
      iVar9 = local_28[lVar6];
      iVar10 = 0;
      iVar11 = 0;
      iVar12 = 0;
      lVar8 = 0x24;
      do {
        iVar9 = iVar9 + *(int *)((long)puVar4 + lVar8 + -0x24);
        iVar10 = iVar10 + *(int *)((long)puVar4 + lVar8 + -0x18);
        iVar11 = iVar11 + *(int *)((long)puVar4 + lVar8 + -0xc);
        iVar12 = iVar12 + *(int *)((long)puVar4 + lVar8);
        lVar8 = lVar8 + 0x30;
      } while (lVar8 != 0xe4);
      iVar9 = iVar12 + iVar10 + iVar11 + iVar9;
      local_28[lVar6] = iVar9;
      iVar7 = iVar7 + (uint)(0 < iVar9);
      lVar6 = lVar6 + 1;
      puVar4 = puVar4 + 1;
    } while (lVar6 != 3);
    if (iVar7 == 1) {
      lVar6 = 0;
      do {
        if (local_28[lVar6] != 0) {
          (cpi->common).features.interp_filter = (InterpFilter)lVar6;
          return;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
    }
  }
  return;
}

Assistant:

void av1_finalize_encoded_frame(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;

  if (!cm->seq_params->reduced_still_picture_hdr &&
      encode_show_existing_frame(cm)) {
    RefCntBuffer *const frame_to_show =
        cm->ref_frame_map[cpi->existing_fb_idx_to_show];

    if (frame_to_show == NULL) {
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Buffer does not contain a reconstructed frame");
    }
    assert(frame_to_show->ref_count > 0);
    assign_frame_buffer_p(&cm->cur_frame, frame_to_show);
  }

  if (!encode_show_existing_frame(cm) &&
      cm->seq_params->film_grain_params_present &&
      (cm->show_frame || cm->showable_frame)) {
    // Copy the current frame's film grain params to the its corresponding
    // RefCntBuffer slot.
    cm->cur_frame->film_grain_params = cm->film_grain_params;

    // We must update the parameters if this is not an INTER_FRAME
    if (current_frame->frame_type != INTER_FRAME)
      cm->cur_frame->film_grain_params.update_parameters = 1;

    // Iterate the random seed for the next frame.
    cm->film_grain_params.random_seed += 3381;
    if (cm->film_grain_params.random_seed == 0)
      cm->film_grain_params.random_seed = 7391;
  }

  // Initialise all tiles' contexts from the global frame context
  for (int tile_col = 0; tile_col < cm->tiles.cols; tile_col++) {
    for (int tile_row = 0; tile_row < cm->tiles.rows; tile_row++) {
      const int tile_idx = tile_row * cm->tiles.cols + tile_col;
      cpi->tile_data[tile_idx].tctx = *cm->fc;
    }
  }

  if (!frame_is_intra_only(cm))
    fix_interp_filter(&cm->features.interp_filter, cpi->td.counts);
}